

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>::getStdDev
          (Accumulator<std::vector<double,_std::allocator<double>_>_> *this)

{
  size_type sVar1;
  reference pvVar2;
  size_type in_RSI;
  allocator_type *in_RDI;
  double dVar3;
  size_t i;
  vector<double,_std::allocator<double>_> variance;
  vector<double,_std::allocator<double>_> *sd;
  allocator_type *this_00;
  ulong local_48;
  vector<double,_std::allocator<double>_> local_40;
  Accumulator<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  std::vector<double,_std::allocator<double>_>::size
            ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x38));
  std::allocator<double>::allocator((allocator<double> *)0x3eb0cd);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_00,in_RSI,in_RDI);
  std::allocator<double>::~allocator((allocator<double> *)0x3eb0ed);
  getVariance(in_stack_ffffffffffffffd8);
  for (local_48 = 0; sVar1 = std::vector<double,_std::allocator<double>_>::size(&local_40),
      local_48 < sVar1; local_48 = local_48 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,local_48);
    dVar3 = sqrt(*pvVar2);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)this_00,local_48);
    *pvVar2 = dVar3;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  return (vector<double,_std::allocator<double>_> *)in_RDI;
}

Assistant:

std::vector<RealType> getStdDev() const {
      std::vector<RealType> sd(Avg_.size());
      std::vector<RealType> variance = this->getVariance();

      for (std::size_t i = 0; i < variance.size(); i++) {
        sd[i] = std::sqrt(variance[i]);
      }

      return sd;
    }